

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  long lVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  
  plVar5 = _domain_list.next;
  while (plVar4 = _domain_metric_postprocessor_list.next, plVar5->prev != _domain_list.prev) {
    plVar4 = plVar5->next;
    for (lVar3 = -0x260; lVar3 != 0; lVar3 = lVar3 + 0x98) {
      rfc5444_writer_unregister_addrtlvtype(&_protocol->writer,(long)&plVar5->next + lVar3);
    }
    plVar1 = plVar5->next;
    plVar2 = plVar5->prev;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    plVar5->next = (list_entity *)0x0;
    plVar5->prev = (list_entity *)0x0;
    oonf_class_free(&_domain_class,plVar5 + -0x2a);
    plVar5 = plVar4;
  }
  while (plVar5 = _domain_listener_list.next, plVar4->prev != _domain_metric_postprocessor_list.prev
        ) {
    plVar5 = plVar4->next;
    nhdp_domain_metric_postprocessor_remove((nhdp_domain_metric_postprocessor *)&plVar4[-1].prev);
    plVar4 = plVar5;
  }
  while (plVar5->prev != _domain_listener_list.prev) {
    plVar4 = plVar5->next;
    nhdp_domain_listener_remove((nhdp_domain_listener *)(plVar5 + -1));
    plVar5 = plVar4;
  }
  oonf_class_remove(&_domain_class);
  return;
}

Assistant:

void
nhdp_domain_cleanup(void) {
  struct nhdp_domain *domain, *d_it;
  struct nhdp_domain_listener *listener, *l_it;
  struct nhdp_domain_metric_postprocessor *processor, *p_it;
  int i;

  list_for_each_element_safe(&_domain_list, domain, _node, d_it) {
    /* free allocated TLVs */
    for (i = 0; i < 4; i++) {
      rfc5444_writer_unregister_addrtlvtype(&_protocol->writer, &domain->_metric_addrtlvs[i]);
    }

    /* remove domain */
    list_remove(&domain->_node);
    oonf_class_free(&_domain_class, domain);
  }

  list_for_each_element_safe(&_domain_metric_postprocessor_list, processor, _node, p_it) {
    nhdp_domain_metric_postprocessor_remove(processor);
  }
  list_for_each_element_safe(&_domain_listener_list, listener, _node, l_it) {
    nhdp_domain_listener_remove(listener);
  }
  oonf_class_remove(&_domain_class);
}